

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O0

void vkt::api::anon_unknown_0::addImageToImageAllFormatsDepthStencilTests(TestCaseGroup *group)

{
  bool bVar1;
  TextureFormat TVar2;
  VkFormat format;
  VkFormat format_00;
  VkFormat format_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  TestParams local_348;
  string local_2f8;
  string local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 local_278 [8];
  string description;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f8 [8];
  string testName;
  VkImageCopy testCopy_1;
  VkImageCopy testCopy;
  ChannelOrder local_138;
  VkExtent3D extent;
  VkOffset3D dstOffset;
  VkOffset3D srcOffset;
  CopyRegion copyRegion;
  deInt32 i;
  VkImageSubresourceLayers defaultStencilSourceLayer;
  VkImageSubresourceLayers defaultDepthSourceLayer;
  TestParams params;
  int compatibleFormatsIndex;
  VkFormat depthAndStencilFormats [7];
  TestCaseGroup *group_local;
  
  depthAndStencilFormats[0] = VK_FORMAT_D32_SFLOAT;
  depthAndStencilFormats[1] = VK_FORMAT_S8_UINT;
  depthAndStencilFormats[2] = VK_FORMAT_D16_UNORM_S8_UINT;
  depthAndStencilFormats[3] = VK_FORMAT_D24_UNORM_S8_UINT;
  depthAndStencilFormats[4] = VK_FORMAT_D32_SFLOAT_S8_UINT;
  for (params._76_4_ = 0; (int)params._76_4_ < 7; params._76_4_ = params._76_4_ + 1) {
    TestParams::TestParams((TestParams *)&defaultDepthSourceLayer.baseArrayLayer);
    defaultDepthSourceLayer.baseArrayLayer = 1;
    params.src.image.extent.depth = 1;
    params.src.buffer.size = (Buffer)0x4000000040;
    params.src.image.extent.width = 1;
    params.dst.buffer.size = (Buffer)0x4000000040;
    params.dst.image.extent.width = 1;
    defaultDepthSourceLayer.layerCount = depthAndStencilFormats[(long)(int)params._76_4_ + -2];
    defaultDepthSourceLayer.aspectMask = 0;
    defaultDepthSourceLayer.mipLevel = 1;
    uVar3 = extraout_RDX;
    params.src.image.operationLayout = defaultDepthSourceLayer.layerCount;
    for (copyRegion.imageBlit.dstOffsets[1].z = 0; copyRegion.imageBlit.dstOffsets[1].z < 0x40;
        copyRegion.imageBlit.dstOffsets[1].z = copyRegion.imageBlit.dstOffsets[1].z + 0x10) {
      srcOffset.x = 0;
      TVar2 = ::vk::mapVkFormat(defaultDepthSourceLayer.layerCount);
      local_138 = TVar2.order;
      bVar1 = tcu::hasDepthComponent(local_138);
      if (bVar1) {
        stack0xfffffffffffffef8 = 2;
        std::
        vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
        ::push_back((vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                     *)&params.dst.image.extent.depth,(value_type *)&srcOffset.z);
      }
      TVar2 = ::vk::mapVkFormat(defaultDepthSourceLayer.layerCount);
      testCopy_1.extent.depth = TVar2.order;
      bVar1 = tcu::hasStencilComponent(testCopy_1.extent.depth);
      uVar3 = extraout_RDX_00;
      if (bVar1) {
        testName.field_2._8_8_ = 4;
        stack0xfffffffffffffef8 = 4;
        std::
        vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
        ::push_back((vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                     *)&params.dst.image.extent.depth,(value_type *)&srcOffset.z);
        uVar3 = extraout_RDX_01;
      }
    }
    api::(anonymous_namespace)::getFormatCaseName_abi_cxx11_
              (&local_238,(_anonymous_namespace_ *)(ulong)defaultDepthSourceLayer.layerCount,
               (VkFormat)uVar3);
    std::operator+(&local_218,&local_238,"_");
    api::(anonymous_namespace)::getFormatCaseName_abi_cxx11_
              ((string *)((long)&description.field_2 + 8),
               (_anonymous_namespace_ *)(ulong)params.src.image.operationLayout,format);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                   &local_218,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&description.field_2 + 8));
    std::__cxx11::string::~string((string *)(description.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    api::(anonymous_namespace)::getFormatCaseName_abi_cxx11_
              (&local_2d8,(_anonymous_namespace_ *)(ulong)defaultDepthSourceLayer.layerCount,
               format_00);
    std::operator+(&local_2b8,"Copy from ",&local_2d8);
    std::operator+(&local_298,&local_2b8," to ");
    api::(anonymous_namespace)::getFormatCaseName_abi_cxx11_
              (&local_2f8,(_anonymous_namespace_ *)(ulong)params.src.image.operationLayout,format_01
              );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                   &local_298,&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2d8);
    TestParams::TestParams(&local_348,(TestParams *)&defaultDepthSourceLayer.baseArrayLayer);
    addTestGroup<vkt::api::(anonymous_namespace)::TestParams>
              (group,(string *)local_1f8,(string *)local_278,
               addImageToImageAllFormatsDepthStencilFormatsTests,&local_348);
    TestParams::~TestParams(&local_348);
    std::__cxx11::string::~string((string *)local_278);
    std::__cxx11::string::~string((string *)local_1f8);
    TestParams::~TestParams((TestParams *)&defaultDepthSourceLayer.baseArrayLayer);
  }
  return;
}

Assistant:

void addImageToImageAllFormatsDepthStencilTests (tcu::TestCaseGroup* group)
{
	const VkFormat	depthAndStencilFormats[]	=
	{
		VK_FORMAT_D16_UNORM,
		VK_FORMAT_X8_D24_UNORM_PACK32,
		VK_FORMAT_D32_SFLOAT,
		VK_FORMAT_S8_UINT,
		VK_FORMAT_D16_UNORM_S8_UINT,
		VK_FORMAT_D24_UNORM_S8_UINT,
		VK_FORMAT_D32_SFLOAT_S8_UINT,
	};

	for (int compatibleFormatsIndex = 0; compatibleFormatsIndex < DE_LENGTH_OF_ARRAY(depthAndStencilFormats); ++compatibleFormatsIndex)
	{
		TestParams	params;
		params.src.image.imageType			= VK_IMAGE_TYPE_2D;
		params.dst.image.imageType			= VK_IMAGE_TYPE_2D;
		params.src.image.extent				= defaultExtent;
		params.dst.image.extent				= defaultExtent;
		params.src.image.format				= depthAndStencilFormats[compatibleFormatsIndex];
		params.dst.image.format				= params.src.image.format;

		const VkImageSubresourceLayers		defaultDepthSourceLayer		= { VK_IMAGE_ASPECT_DEPTH_BIT, 0u, 0u, 1u };
		const VkImageSubresourceLayers		defaultStencilSourceLayer	= { VK_IMAGE_ASPECT_STENCIL_BIT, 0u, 0u, 1u };

		for (deInt32 i = 0; i < defaultSize; i += defaultFourthSize)
		{
			CopyRegion			copyRegion;
			const VkOffset3D	srcOffset	= {0, 0, 0};
			const VkOffset3D	dstOffset	= {i, defaultSize - i - defaultFourthSize, 0};
			const VkExtent3D	extent		= {defaultFourthSize, defaultFourthSize, 1};

			if (tcu::hasDepthComponent(mapVkFormat(params.src.image.format).order))
			{
				const VkImageCopy				testCopy	=
				{
					defaultDepthSourceLayer,	// VkImageSubresourceLayers	srcSubresource;
					srcOffset,					// VkOffset3D				srcOffset;
					defaultDepthSourceLayer,	// VkImageSubresourceLayers	dstSubresource;
					dstOffset,					// VkOffset3D				dstOffset;
					extent,						// VkExtent3D				extent;
				};

				copyRegion.imageCopy	= testCopy;
				params.regions.push_back(copyRegion);
			}
			if (tcu::hasStencilComponent(mapVkFormat(params.src.image.format).order))
			{
				const VkImageCopy				testCopy	=
				{
					defaultStencilSourceLayer,	// VkImageSubresourceLayers	srcSubresource;
					srcOffset,					// VkOffset3D				srcOffset;
					defaultStencilSourceLayer,	// VkImageSubresourceLayers	dstSubresource;
					dstOffset,					// VkOffset3D				dstOffset;
					extent,						// VkExtent3D				extent;
				};

				copyRegion.imageCopy	= testCopy;
				params.regions.push_back(copyRegion);
			}
		}

		const std::string testName		= getFormatCaseName(params.src.image.format) + "_" + getFormatCaseName(params.dst.image.format);
		const std::string description	= "Copy from " + getFormatCaseName(params.src.image.format) + " to " + getFormatCaseName(params.dst.image.format);
		addTestGroup(group, testName, description, addImageToImageAllFormatsDepthStencilFormatsTests, params);
	}
}